

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int cfd::capi::SetLastFatalError(void *handle,char *message)

{
  CfdException *except;
  void *in_stack_ffffffffffffffc8;
  CfdCapiManager *in_stack_ffffffffffffffd0;
  
  CfdCapiManager::SetLastFatalError
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(char *)0x5a45d4);
  return 0;
}

Assistant:

int SetLastFatalError(void* handle, const char* message) {
  try {
    cfd::capi::capi_instance.SetLastFatalError(handle, message);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}